

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

XMLElement * CGL::Collada::ColladaParser::get_element(XMLElement *xml,string *query)

{
  istream *piVar1;
  char *pcVar2;
  allocator local_209;
  string token;
  string local_1e8;
  string id;
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)query,_S_out|_S_in);
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  do {
    if (xml == (XMLElement *)0x0) {
      xml = (XMLElement *)0x0;
LAB_001118cc:
      std::__cxx11::string::~string((string *)&token);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return xml;
    }
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&token,'/');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      pcVar2 = tinyxml2::XMLElement::Attribute(xml,"url",(char *)0x0);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::string((string *)&id,pcVar2 + 1,&local_209);
        std::__cxx11::string::string((string *)&local_1e8,(string *)&id);
        xml = uri_find(&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&id);
      }
      goto LAB_001118cc;
    }
    xml = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,token._M_dataplus._M_p);
  } while( true );
}

Assistant:

XMLElement* ColladaParser::get_element( XMLElement* xml, string query ) {

  stringstream ss (query);

  // find xml element
  XMLElement* e = xml; string token;
  while( e && getline(ss, token, '/') ) {
    e = e->FirstChildElement( token.c_str() );
  }

  // handle indirection
  if (e) {
    const char* url = e->Attribute("url");
    if (url) {
      string id = url + 1;
      e = uri_find(id);
    }
  }

  return e;
}